

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  num_writer f;
  char cVar1;
  uint uVar2;
  string_view prefix;
  undefined4 uStack_14;
  
  uVar2 = internal::count_digits(this->abs_value);
  cVar1 = internal::thousands_sep<char>
                    ((this->writer->locale_)._M_t.
                     super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
                     .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl);
  uVar2 = uVar2 + (uVar2 - 1) / 3;
  uStack_14 = CONCAT31(uStack_14._1_3_,cVar1);
  f._12_4_ = uStack_14;
  f.size = uVar2;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this->writer,uVar2,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      unsigned num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_.get());
      unsigned size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }